

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall
Catch::XmlReporter::listListeners
          (XmlReporter *this,
          vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>
          *descriptions)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pLVar2;
  StringRef text;
  XmlWriter *this_00;
  pointer pLVar3;
  ScopedElement outerTag;
  ScopedElement inner;
  string local_70;
  ScopedElement local_50;
  
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"RegisteredListeners","");
  this_00 = &this->m_xml;
  XmlWriter::scopedElement((XmlWriter *)&local_50,(string *)this_00,(XmlFormatting)&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pLVar3 = (descriptions->
           super__Vector_base<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pLVar2 = (descriptions->
           super__Vector_base<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pLVar3 != pLVar2) {
    do {
      local_70._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Listener","");
      XmlWriter::scopedElement
                ((XmlWriter *)&stack0xffffffffffffffc0,(string *)this_00,(XmlFormatting)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      local_70._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Name","");
      XmlWriter::startElement(this_00,&local_70,Indent);
      XmlWriter::writeText(this_00,pLVar3->name,None);
      XmlWriter::endElement(this_00,Newline);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      local_70._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Description","");
      XmlWriter::startElement(this_00,&local_70,Indent);
      text.m_start = (pLVar3->description)._M_dataplus._M_p;
      text.m_size = (pLVar3->description)._M_string_length;
      XmlWriter::writeText(this_00,text,None);
      XmlWriter::endElement(this_00,Newline);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&stack0xffffffffffffffc0);
      pLVar3 = pLVar3 + 1;
    } while (pLVar3 != pLVar2);
  }
  XmlWriter::ScopedElement::~ScopedElement(&local_50);
  return;
}

Assistant:

void XmlReporter::listListeners(std::vector<ListenerDescription> const& descriptions) {
        auto outerTag = m_xml.scopedElement( "RegisteredListeners" );
        for ( auto const& listener : descriptions ) {
            auto inner = m_xml.scopedElement( "Listener" );
            m_xml.startElement( "Name", XmlFormatting::Indent )
                .writeText( listener.name, XmlFormatting::None )
                .endElement( XmlFormatting::Newline );
            m_xml.startElement( "Description", XmlFormatting::Indent )
                .writeText( listener.description, XmlFormatting::None )
                .endElement( XmlFormatting::Newline );
        }
    }